

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * flatbuffers::cpp::CppGenerator::NativeName
                   (string *__return_storage_ptr__,string *name,StructDef *sd,IDLOptions *opts)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  IDLOptions *local_28;
  IDLOptions *opts_local;
  StructDef *sd_local;
  string *name_local;
  
  bVar1 = false;
  local_28 = opts;
  opts_local = (IDLOptions *)sd;
  sd_local = (StructDef *)name;
  name_local = __return_storage_ptr__;
  if ((sd == (StructDef *)0x0) || ((sd->fixed & 1U) != 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::operator+(&local_48,&opts->object_prefix,name);
    bVar1 = true;
    std::operator+(__return_storage_ptr__,&local_48,&local_28->object_suffix);
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string NativeName(const std::string &name, const StructDef *sd,
                                const IDLOptions &opts) {
    return sd && !sd->fixed ? opts.object_prefix + name + opts.object_suffix
                            : name;
  }